

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::BufferLoadStoreTestInstance::prepareDescriptors
          (BufferLoadStoreTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)19>_> *this_00;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetLayoutBuilder *pDVar1;
  DescriptorPoolBuilder *pDVar2;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_b8;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_98;
  DescriptorSetLayoutBuilder local_78;
  
  vk = Context::getDeviceInterface
                 ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  device = Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_78);
  pDVar1 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (&local_78,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,0x20);
  pDVar1 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar1,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_98,pDVar1,vk,device,0);
  local_b8.m_data.deleter.m_device = local_98.m_data.deleter.m_device;
  local_b8.m_data.deleter.m_allocator = local_98.m_data.deleter.m_allocator;
  local_b8.m_data.object.m_internal = local_98.m_data.object.m_internal;
  local_b8.m_data.deleter.m_deviceIface = local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_descriptorSetLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = local_b8.m_data.deleter.m_device;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = local_b8.m_data.deleter.m_allocator;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       local_b8.m_data.object.m_internal;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = local_b8.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_98);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_78);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_98);
  pDVar2 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&local_98,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1);
  pDVar2 = ::vk::DescriptorPoolBuilder::addType(pDVar2,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_b8,pDVar2,vk,device,1,1);
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_78.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       (deUint64)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_b8);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_98);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_b8,vk,device,
                    (VkDescriptorPool)
                    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    object.m_internal,
                    (VkDescriptorSetLayout)
                    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                    m_data.object.m_internal);
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = (deUint64)
               local_78.m_immutableSamplerInfos.
               super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       (deUint64)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&local_b8);
  makeBufferView((Move<vk::Handle<(vk::HandleType)12>_> *)&local_b8,vk,device,
                 (VkBuffer)
                 (((this->super_LoadStoreTestInstance).m_imageBuffer.
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                 object.m_internal,
                 (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,0,
                 (this->super_LoadStoreTestInstance).m_imageSizeBytes);
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::reset
            (&(this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>);
  (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       (VkDevice)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_78.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       (deUint64)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)12>_> *)&local_b8);
  makeBufferView((Move<vk::Handle<(vk::HandleType)12>_> *)&local_b8,vk,device,
                 (VkBuffer)
                 (((this->m_imageBufferDst).
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                 object.m_internal,
                 (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,0,
                 (this->super_LoadStoreTestInstance).m_imageSizeBytes);
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::reset
            (&(this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>);
  (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       (VkDevice)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_78.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       (deUint64)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)12>_> *)&local_b8);
  return (VkDescriptorSetLayout)
         (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
}

Assistant:

VkDescriptorSetLayout BufferLoadStoreTestInstance::prepareDescriptors (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);
	m_bufferViewSrc = makeBufferView(vk, device, m_imageBuffer->get(), m_format, 0ull, m_imageSizeBytes);
	m_bufferViewDst = makeBufferView(vk, device, m_imageBufferDst->get(), m_format, 0ull, m_imageSizeBytes);

	return *m_descriptorSetLayout;  // not passing the ownership
}